

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

bool __thiscall
compiler::EmissionContext::GetDeclarationIndex
          (EmissionContext *this,string *var,size_t *index,bool considerPartiallyBound)

{
  __type _Var1;
  reference pvVar2;
  size_type __n;
  size_type local_38;
  size_t i;
  bool considerPartiallyBound_local;
  size_t *index_local;
  string *var_local;
  EmissionContext *this_local;
  
  local_38 = this->firstFreeVariablesIndex;
  do {
    do {
      __n = local_38 - 1;
      if (local_38 == 0) {
        return false;
      }
      pvVar2 = std::
               vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
               ::at(&this->variables,__n);
      local_38 = __n;
    } while (((pvVar2->isFullyBound & 1U) == 0) && (!considerPartiallyBound));
    pvVar2 = std::
             vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
             at(&this->variables,__n);
    _Var1 = std::operator==(&pvVar2->value,var);
  } while (!_Var1);
  *index = __n;
  return true;
}

Assistant:

bool GetDeclarationIndex(const std::string & var, std::size_t& index, bool considerPartiallyBound) {

    for (std::size_t i = this->firstFreeVariablesIndex; i-- > 0;) {
      if (!variables.at(i).isFullyBound && !considerPartiallyBound) {
        continue;
      }

      if (variables.at(i).value == var) {
        index = i;
        return true;
      }
    }

    return false;
  }